

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_main.c
# Opt level: O0

void setup_signalhandler(void)

{
  memset(&setup_signalhandler::act,0,0x98);
  sigemptyset((sigset_t *)&setup_signalhandler::act.sa_mask);
  setup_signalhandler::act.sa_flags = 0;
  setup_signalhandler::act.__sigaction_handler.sa_handler = quit_signal_handler;
  sigaction(2,(sigaction *)&setup_signalhandler::act,(sigaction *)0x0);
  sigaction(3,(sigaction *)&setup_signalhandler::act,(sigaction *)0x0);
  sigaction(4,(sigaction *)&setup_signalhandler::act,(sigaction *)0x0);
  sigaction(6,(sigaction *)&setup_signalhandler::act,(sigaction *)0x0);
  sigaction(0xf,(sigaction *)&setup_signalhandler::act,(sigaction *)0x0);
  setup_signalhandler::act.__sigaction_handler =
       (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
  sigaction(0xd,(sigaction *)&setup_signalhandler::act,(sigaction *)0x0);
  sigaction(10,(sigaction *)&setup_signalhandler::act,(sigaction *)0x0);
  sigaction(0xc,(sigaction *)&setup_signalhandler::act,(sigaction *)0x0);
  setup_signalhandler::act.__sigaction_handler.sa_handler = hup_signal_handler;
  sigaction(1,(sigaction *)&setup_signalhandler::act,(sigaction *)0x0);
  return;
}

Assistant:

static void
setup_signalhandler(void) {
  static struct sigaction act;

  memset(&act, 0, sizeof(act));

  /* setup signal handler first */
  sigemptyset(&act.sa_mask);
  act.sa_flags = 0;

  act.sa_handler = quit_signal_handler;
  sigaction(SIGINT, &act, NULL);
  sigaction(SIGQUIT, &act, NULL);
  sigaction(SIGILL, &act, NULL);
  sigaction(SIGABRT, &act, NULL);
  sigaction(SIGTERM, &act, NULL);

  act.sa_handler = SIG_IGN;
  sigaction(SIGPIPE, &act, NULL);
  sigaction(SIGUSR1, &act, NULL);
  sigaction(SIGUSR2, &act, NULL);

  act.sa_handler = hup_signal_handler;
  sigaction(SIGHUP, &act, NULL);
}